

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string_view google::protobuf::internal::ShortEditionName(Edition edition)

{
  string *psVar1;
  string_view sVar2;
  string_view str;
  
  psVar1 = Edition_Name<google::protobuf::Edition>(edition);
  sVar2._M_str = "EDITION_";
  sVar2._M_len = 8;
  str._M_str = (psVar1->_M_dataplus)._M_p;
  str._M_len = psVar1->_M_string_length;
  sVar2 = absl::lts_20250127::StripPrefix(str,sVar2);
  return sVar2;
}

Assistant:

absl::string_view ShortEditionName(Edition edition) {
  return absl::StripPrefix(Edition_Name(edition), "EDITION_");
}